

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp.cpp
# Opt level: O0

MPP_RET __thiscall Mpp::put_frame(Mpp *this,MppFrame frame)

{
  MPP_RET MVar1;
  RK_S32 RVar2;
  RK_S64 RVar3;
  int iVar4;
  Mpp *in_RCX;
  MppFrame local_50;
  MppFrame frm_out;
  MppBuffer md_info_buf;
  MppPacket packet;
  MppMeta meta;
  MppStopwatch stopwatch;
  MppFrame pvStack_20;
  MPP_RET ret;
  MppFrame frame_local;
  Mpp *this_local;
  
  if (this->mInitDone == 0) {
    return MPP_ERR_INIT;
  }
  pvStack_20 = frame;
  frame_local = this;
  if ((mpp_debug & 2) != 0) {
    RVar3 = mpp_frame_get_pts(frame);
    in_RCX = (Mpp *)0x0;
    _mpp_log_l(4,"mpp","%p input frame pts %lld\n",(char *)0x0,this,RVar3);
  }
  if (((this->mKmpp != (Kmpp *)0x0) && (this->mKmpp->mApi != (KmppOps *)0x0)) &&
     (this->mKmpp->mApi->put_frame != (_func_MPP_RET_Kmpp_ptr_MppFrame *)0x0)) {
    MVar1 = (*this->mKmpp->mApi->put_frame)(this->mKmpp,pvStack_20);
    return MVar1;
  }
  if (this->mInputTimeout == MPP_POLL_NON_BLOCK) {
    set_io_mode(this,MPP_IO_MODE_NORMAL);
    MVar1 = put_frame_async(this,pvStack_20);
    return MVar1;
  }
  stopwatch._4_4_ = 0xffffffff;
  meta = (MppMeta)0x0;
  if ((mpp_debug & 1) != 0) {
    mpp_frame_set_stopwatch_enable(pvStack_20,1);
    meta = mpp_frame_get_stopwatch(pvStack_20);
  }
  mpp_stopwatch_record(meta,(char *)0x0);
  mpp_stopwatch_record(meta,"put frame start");
  iVar4 = (int)in_RCX;
  if (this->mInputTask == (MppTask)0x0) {
    mpp_stopwatch_record(meta,"input port user poll");
    stopwatch._4_4_ = poll(this,(pollfd *)0x0,(ulong)(uint)this->mInputTimeout,iVar4);
    if (stopwatch._4_4_ < MPP_OK) {
      if (this->mInputTimeout != MPP_POLL_NON_BLOCK) {
        _mpp_log_l(4,"mpp","poll on set timeout %d ret %d\n","put_frame",
                   (ulong)(uint)this->mInputTimeout,(ulong)(uint)stopwatch._4_4_);
      }
      goto LAB_0013ab3c;
    }
    mpp_stopwatch_record(meta,"input port user dequeue");
    stopwatch._4_4_ = dequeue(this,MPP_PORT_INPUT,&this->mInputTask);
    if ((stopwatch._4_4_ != MPP_OK) || (this->mInputTask == (MppTask)0x0)) {
      _mpp_log_l(4,"mpp","dequeue on set ret %d task %p\n","put_frame",(ulong)(uint)stopwatch._4_4_,
                 this->mInputTask);
      goto LAB_0013ab3c;
    }
    stopwatch._4_4_ = 0;
    in_RCX = this;
  }
  iVar4 = (int)in_RCX;
  if (this->mInputTask == (MppTask)0x0) {
    iVar4 = 0;
    _mpp_log_l(2,"mpp","Assertion %s failed at %s:%d\n",(char *)0x0,"mInputTask","put_frame",0x2cc);
    if ((mpp_debug & 0x10000000) != 0) {
      abort();
    }
  }
  stopwatch._4_4_ = mpp_task_meta_set_frame(this->mInputTask,KEY_INPUT_FRAME,pvStack_20);
  if (stopwatch._4_4_ == MPP_OK) {
    RVar2 = mpp_frame_has_meta(pvStack_20);
    if (RVar2 != 0) {
      packet = mpp_frame_get_meta(pvStack_20);
      md_info_buf = (MppBuffer)0x0;
      frm_out = (MppFrame)0x0;
      mpp_meta_get_packet(packet,KEY_OUTPUT_PACKET,&md_info_buf);
      if (md_info_buf != (MppBuffer)0x0) {
        stopwatch._4_4_ = mpp_task_meta_set_packet(this->mInputTask,KEY_OUTPUT_PACKET,md_info_buf);
        if (stopwatch._4_4_ != MPP_OK) {
          _mpp_log_l(4,"mpp","set output packet to task ret %d\n","put_frame",
                     (ulong)(uint)stopwatch._4_4_);
          goto LAB_0013ab3c;
        }
        stopwatch._4_4_ = MPP_OK;
      }
      mpp_meta_get_buffer(packet,KEY_MOTION_INFO,&frm_out);
      if (frm_out != (MppFrame)0x0) {
        stopwatch._4_4_ = mpp_task_meta_set_buffer(this->mInputTask,KEY_MOTION_INFO,frm_out);
        if (stopwatch._4_4_ != MPP_OK) {
          _mpp_log_l(4,"mpp","set output motion dection info ret %d\n","put_frame",
                     (ulong)(uint)stopwatch._4_4_);
          goto LAB_0013ab3c;
        }
        stopwatch._4_4_ = MPP_OK;
      }
    }
    mpp_ops_enc_put_frm(this->mDump,pvStack_20);
    mpp_stopwatch_record(meta,"input port user enqueue");
    stopwatch._4_4_ = enqueue(this,MPP_PORT_INPUT,this->mInputTask);
    if (stopwatch._4_4_ == MPP_OK) {
      this->mInputTask = (MppTask)0x0;
      mpp_stopwatch_record(meta,"input port user poll");
      stopwatch._4_4_ = poll(this,(pollfd *)0x0,(ulong)(uint)this->mInputTimeout,iVar4);
      if (stopwatch._4_4_ < MPP_OK) {
        if (this->mInputTimeout != MPP_POLL_NON_BLOCK) {
          _mpp_log_l(4,"mpp","poll on get timeout %d ret %d\n","put_frame",
                     (ulong)(uint)this->mInputTimeout,(ulong)(uint)stopwatch._4_4_);
        }
      }
      else {
        mpp_stopwatch_record(meta,"input port user dequeue");
        stopwatch._4_4_ = dequeue(this,MPP_PORT_INPUT,&this->mInputTask);
        if (stopwatch._4_4_ == MPP_OK) {
          if ((this->mInputTask == (MppTask)0x0) &&
             (_mpp_log_l(2,"mpp","Assertion %s failed at %s:%d\n",(char *)0x0,"mInputTask",
                         "put_frame",0x30a), (mpp_debug & 0x10000000) != 0)) {
            abort();
          }
          if (this->mInputTask != (MppTask)0x0) {
            local_50 = (MppFrame)0x0;
            mpp_task_meta_get_frame(this->mInputTask,KEY_INPUT_FRAME,&local_50);
            if ((local_50 != pvStack_20) &&
               (_mpp_log_l(2,"mpp","Assertion %s failed at %s:%d\n",(char *)0x0,"frm_out == frame",
                           "put_frame",0x30f), (mpp_debug & 0x10000000) != 0)) {
              abort();
            }
          }
        }
        else {
          _mpp_log_l(4,"mpp","dequeue on get ret %d\n","put_frame",(ulong)(uint)stopwatch._4_4_);
        }
      }
    }
    else {
      _mpp_log_l(4,"mpp","enqueue ret %d\n","put_frame",(ulong)(uint)stopwatch._4_4_);
    }
  }
  else {
    _mpp_log_l(4,"mpp","set input frame to task ret %d\n","put_frame",(ulong)(uint)stopwatch._4_4_);
  }
LAB_0013ab3c:
  mpp_stopwatch_record(meta,"put_frame finish");
  mpp_frame_set_stopwatch_enable(pvStack_20,0);
  return stopwatch._4_4_;
}

Assistant:

MPP_RET Mpp::put_frame(MppFrame frame)
{
    if (!mInitDone)
        return MPP_ERR_INIT;

    mpp_dbg_pts("%p input frame pts %lld\n", this, mpp_frame_get_pts(frame));

    if (mKmpp && mKmpp->mApi && mKmpp->mApi->put_frame)
        return mKmpp->mApi->put_frame(mKmpp, frame);

    if (mInputTimeout == MPP_POLL_NON_BLOCK) {
        set_io_mode(MPP_IO_MODE_NORMAL);
        return put_frame_async(frame);
    }

    MPP_RET ret = MPP_NOK;
    MppStopwatch stopwatch = NULL;

    if (mpp_debug & MPP_DBG_TIMING) {
        mpp_frame_set_stopwatch_enable(frame, 1);
        stopwatch = mpp_frame_get_stopwatch(frame);
    }

    mpp_stopwatch_record(stopwatch, NULL);
    mpp_stopwatch_record(stopwatch, "put frame start");

    if (mInputTask == NULL) {
        mpp_stopwatch_record(stopwatch, "input port user poll");
        /* poll input port for valid task */
        ret = poll(MPP_PORT_INPUT, mInputTimeout);
        if (ret < 0) {
            if (mInputTimeout)
                mpp_log_f("poll on set timeout %d ret %d\n", mInputTimeout, ret);
            goto RET;
        }

        /* dequeue task for setup */
        mpp_stopwatch_record(stopwatch, "input port user dequeue");
        ret = dequeue(MPP_PORT_INPUT, &mInputTask);
        if (ret || NULL == mInputTask) {
            mpp_log_f("dequeue on set ret %d task %p\n", ret, mInputTask);
            goto RET;
        }
    }

    mpp_assert(mInputTask);

    /* setup task */
    ret = mpp_task_meta_set_frame(mInputTask, KEY_INPUT_FRAME, frame);
    if (ret) {
        mpp_log_f("set input frame to task ret %d\n", ret);
        goto RET;
    }

    if (mpp_frame_has_meta(frame)) {
        MppMeta meta = mpp_frame_get_meta(frame);
        MppPacket packet = NULL;
        MppBuffer md_info_buf = NULL;

        mpp_meta_get_packet(meta, KEY_OUTPUT_PACKET, &packet);
        if (packet) {
            ret = mpp_task_meta_set_packet(mInputTask, KEY_OUTPUT_PACKET, packet);
            if (ret) {
                mpp_log_f("set output packet to task ret %d\n", ret);
                goto RET;
            }
        }

        mpp_meta_get_buffer(meta, KEY_MOTION_INFO, &md_info_buf);
        if (md_info_buf) {
            ret = mpp_task_meta_set_buffer(mInputTask, KEY_MOTION_INFO, md_info_buf);
            if (ret) {
                mpp_log_f("set output motion dection info ret %d\n", ret);
                goto RET;
            }
        }
    }

    // dump input
    mpp_ops_enc_put_frm(mDump, frame);

    /* enqueue valid task to encoder */
    mpp_stopwatch_record(stopwatch, "input port user enqueue");
    ret = enqueue(MPP_PORT_INPUT, mInputTask);
    if (ret) {
        mpp_log_f("enqueue ret %d\n", ret);
        goto RET;
    }

    mInputTask = NULL;
    /* wait enqueued task finished */
    mpp_stopwatch_record(stopwatch, "input port user poll");
    ret = poll(MPP_PORT_INPUT, mInputTimeout);
    if (ret < 0) {
        if (mInputTimeout)
            mpp_log_f("poll on get timeout %d ret %d\n", mInputTimeout, ret);
        goto RET;
    }

    /* get previous enqueued task back */
    mpp_stopwatch_record(stopwatch, "input port user dequeue");
    ret = dequeue(MPP_PORT_INPUT, &mInputTask);
    if (ret) {
        mpp_log_f("dequeue on get ret %d\n", ret);
        goto RET;
    }

    mpp_assert(mInputTask);
    if (mInputTask) {
        MppFrame frm_out = NULL;

        mpp_task_meta_get_frame(mInputTask, KEY_INPUT_FRAME, &frm_out);
        mpp_assert(frm_out == frame);
    }

RET:
    mpp_stopwatch_record(stopwatch, "put_frame finish");
    mpp_frame_set_stopwatch_enable(frame, 0);
    return ret;
}